

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8 * google::protobuf::io::CodedOutputStream::WriteStringWithSizeToArray
                  (string *str,uint8 *target)

{
  uint32 value;
  uint8 *puVar1;
  uint8 *in_RSI;
  uint8 *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  
  value = std::__cxx11::string::size();
  WriteVarint32ToArray(value,in_RSI);
  puVar1 = WriteStringToArray(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  return puVar1;
}

Assistant:

uint8* CodedOutputStream::WriteStringWithSizeToArray(const std::string& str,
                                                     uint8* target) {
  GOOGLE_DCHECK_LE(str.size(), kuint32max);
  target = WriteVarint32ToArray(str.size(), target);
  return WriteStringToArray(str, target);
}